

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 (*pauVar17) [16];
  undefined4 uVar18;
  float *vertices;
  undefined1 (*pauVar19) [16];
  AABBNodeMB4D *node1;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  RTCRayQueryContext *pRVar23;
  uint uVar24;
  ulong uVar25;
  int *piVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  RTCIntersectArguments *pRVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  float fVar51;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar49;
  float fVar50;
  undefined1 auVar48 [64];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar66;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar64;
  float fVar65;
  undefined1 auVar63 [64];
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar77;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar78;
  float fVar96;
  float fVar98;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar100;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar79;
  float fVar97;
  float fVar99;
  float fVar101;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar102;
  float fVar103;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar117;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar118;
  undefined1 auVar111 [16];
  float fVar116;
  float fVar119;
  undefined1 auVar112 [16];
  float fVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [64];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [64];
  float fVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar152;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar150;
  float fVar151;
  undefined1 auVar149 [64];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  float fVar158;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar159 [64];
  float fVar163;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar164 [64];
  float fVar170;
  undefined1 auVar171 [16];
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar172 [64];
  float fVar176;
  undefined1 auVar177 [16];
  float fVar182;
  undefined1 auVar178 [16];
  float fVar180;
  float fVar181;
  undefined1 auVar179 [64];
  float fVar183;
  undefined1 auVar184 [16];
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar185 [64];
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_12a9;
  ulong local_12a8;
  ulong local_12a0;
  undefined8 local_1298;
  float fStack_1290;
  float fStack_128c;
  undefined1 local_1288 [16];
  undefined1 local_1278 [16];
  RayQueryContext *local_1260;
  undefined1 local_1258 [16];
  int local_123c;
  undefined1 local_1238 [8];
  float fStack_1230;
  float fStack_122c;
  undefined1 local_1228 [8];
  float fStack_1220;
  float fStack_121c;
  undefined1 local_1218 [8];
  float fStack_1210;
  float fStack_120c;
  undefined1 local_1208 [16];
  RTCFilterFunctionNArguments local_11f8;
  undefined1 local_11c8 [8];
  float fStack_11c0;
  float fStack_11bc;
  undefined1 local_11b8 [16];
  undefined1 local_11a8 [16];
  undefined1 local_1198 [8];
  float fStack_1190;
  float fStack_118c;
  ulong local_1188;
  long local_1180;
  long local_1178;
  Scene *local_1170;
  undefined4 local_1168;
  undefined4 local_1164;
  undefined4 local_1160;
  undefined4 local_115c;
  undefined4 local_1158;
  undefined4 local_1154;
  uint local_1150;
  uint local_114c;
  uint local_1148;
  undefined1 local_1138 [16];
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 *local_10d8;
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar19 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    aVar4 = (ray->super_RayK<1>).dir.field_0;
    auVar94 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    fVar52 = (ray->super_RayK<1>).tfar;
    auVar63 = ZEXT464((uint)fVar52);
    auVar68 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar52));
    auVar84._8_4_ = 0x7fffffff;
    auVar84._0_8_ = 0x7fffffff7fffffff;
    auVar84._12_4_ = 0x7fffffff;
    auVar84 = vandps_avx((undefined1  [16])aVar4,auVar84);
    auVar121._8_4_ = 0x219392ef;
    auVar121._0_8_ = 0x219392ef219392ef;
    auVar121._12_4_ = 0x219392ef;
    auVar84 = vcmpps_avx(auVar84,auVar121,1);
    auVar122._8_4_ = 0x3f800000;
    auVar122._0_8_ = 0x3f8000003f800000;
    auVar122._12_4_ = 0x3f800000;
    auVar121 = vdivps_avx(auVar122,(undefined1  [16])aVar4);
    auVar123._8_4_ = 0x5d5e0b6b;
    auVar123._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar123._12_4_ = 0x5d5e0b6b;
    auVar84 = vblendvps_avx(auVar121,auVar123,auVar84);
    auVar104._0_4_ = auVar84._0_4_ * 0.99999964;
    auVar104._4_4_ = auVar84._4_4_ * 0.99999964;
    auVar104._8_4_ = auVar84._8_4_ * 0.99999964;
    auVar104._12_4_ = auVar84._12_4_ * 0.99999964;
    auVar80._0_4_ = auVar84._0_4_ * 1.0000004;
    auVar80._4_4_ = auVar84._4_4_ * 1.0000004;
    auVar80._8_4_ = auVar84._8_4_ * 1.0000004;
    auVar80._12_4_ = auVar84._12_4_ * 1.0000004;
    uVar18 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_fd8._4_4_ = uVar18;
    local_fd8._0_4_ = uVar18;
    local_fd8._8_4_ = uVar18;
    local_fd8._12_4_ = uVar18;
    auVar149 = ZEXT1664(local_fd8);
    uVar18 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_fe8._4_4_ = uVar18;
    local_fe8._0_4_ = uVar18;
    local_fe8._8_4_ = uVar18;
    local_fe8._12_4_ = uVar18;
    auVar156 = ZEXT1664(local_fe8);
    local_ff8 = vshufps_avx(auVar104,auVar104,0);
    auVar157 = ZEXT1664(local_ff8);
    auVar84 = vmovshdup_avx(auVar104);
    local_1008 = vshufps_avx(auVar104,auVar104,0x55);
    auVar159 = ZEXT1664(local_1008);
    auVar121 = vshufpd_avx(auVar104,auVar104,1);
    local_1018 = vshufps_avx(auVar104,auVar104,0xaa);
    auVar164 = ZEXT1664(local_1018);
    local_1028 = vshufps_avx(auVar80,auVar80,0);
    auVar172 = ZEXT1664(local_1028);
    uVar22 = (ulong)(auVar104._0_4_ < 0.0) << 4;
    local_1038 = vshufps_avx(auVar80,auVar80,0x55);
    auVar179 = ZEXT1664(local_1038);
    local_1048 = vshufps_avx(auVar80,auVar80,0xaa);
    auVar185 = ZEXT1664(local_1048);
    uVar27 = (ulong)(auVar84._0_4_ < 0.0) << 4 | 0x20;
    uVar35 = (ulong)(auVar121._0_4_ < 0.0) << 4 | 0x40;
    uVar38 = uVar22 ^ 0x10;
    uVar39 = uVar27 ^ 0x10;
    uVar25 = uVar35 ^ 0x10;
    local_1058 = vshufps_avx(auVar94,auVar94,0);
    auVar142 = ZEXT1664(local_1058);
    auVar84 = vshufps_avx(auVar68,auVar68,0);
    auVar48 = ZEXT1664(auVar84);
    local_1128 = mm_lookupmask_ps._240_8_;
    uStack_1120 = mm_lookupmask_ps._248_8_;
    uVar18 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_1138._4_4_ = uVar18;
    local_1138._0_4_ = uVar18;
    local_1138._8_4_ = uVar18;
    local_1138._12_4_ = uVar18;
    auVar135 = ZEXT1664(local_1138);
    local_1188 = uVar22;
    local_1260 = context;
    local_12a0 = uVar27;
    local_12a8 = uVar35;
LAB_011dcb59:
    do {
      pauVar17 = pauVar19 + -1;
      pauVar19 = pauVar19 + -1;
      if (*(float *)(*pauVar17 + 8) <= auVar63._0_4_) {
        uVar40 = *(ulong *)*pauVar19;
        while ((uVar40 & 8) == 0) {
          uVar20 = uVar40 & 0xfffffffffffffff0;
          fVar52 = (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar94._4_4_ = fVar52;
          auVar94._0_4_ = fVar52;
          auVar94._8_4_ = fVar52;
          auVar94._12_4_ = fVar52;
          pfVar3 = (float *)(uVar20 + 0x80 + uVar22);
          pfVar1 = (float *)(uVar20 + 0x20 + uVar22);
          auVar68._0_4_ = fVar52 * *pfVar3 + *pfVar1;
          auVar68._4_4_ = fVar52 * pfVar3[1] + pfVar1[1];
          auVar68._8_4_ = fVar52 * pfVar3[2] + pfVar1[2];
          auVar68._12_4_ = fVar52 * pfVar3[3] + pfVar1[3];
          auVar84 = vsubps_avx(auVar68,auVar149._0_16_);
          auVar69._0_4_ = auVar157._0_4_ * auVar84._0_4_;
          auVar69._4_4_ = auVar157._4_4_ * auVar84._4_4_;
          auVar69._8_4_ = auVar157._8_4_ * auVar84._8_4_;
          auVar69._12_4_ = auVar157._12_4_ * auVar84._12_4_;
          pfVar3 = (float *)(uVar20 + 0x80 + uVar27);
          auVar84 = vmaxps_avx(auVar142._0_16_,auVar69);
          pfVar1 = (float *)(uVar20 + 0x20 + uVar27);
          auVar81._0_4_ = fVar52 * *pfVar3 + *pfVar1;
          auVar81._4_4_ = fVar52 * pfVar3[1] + pfVar1[1];
          auVar81._8_4_ = fVar52 * pfVar3[2] + pfVar1[2];
          auVar81._12_4_ = fVar52 * pfVar3[3] + pfVar1[3];
          auVar121 = vsubps_avx(auVar81,auVar156._0_16_);
          pfVar3 = (float *)(uVar20 + 0x80 + uVar35);
          pfVar1 = (float *)(uVar20 + 0x20 + uVar35);
          auVar105._0_4_ = fVar52 * *pfVar3 + *pfVar1;
          auVar105._4_4_ = fVar52 * pfVar3[1] + pfVar1[1];
          auVar105._8_4_ = fVar52 * pfVar3[2] + pfVar1[2];
          auVar105._12_4_ = fVar52 * pfVar3[3] + pfVar1[3];
          auVar82._0_4_ = auVar159._0_4_ * auVar121._0_4_;
          auVar82._4_4_ = auVar159._4_4_ * auVar121._4_4_;
          auVar82._8_4_ = auVar159._8_4_ * auVar121._8_4_;
          auVar82._12_4_ = auVar159._12_4_ * auVar121._12_4_;
          auVar121 = vsubps_avx(auVar105,auVar135._0_16_);
          auVar106._0_4_ = auVar164._0_4_ * auVar121._0_4_;
          auVar106._4_4_ = auVar164._4_4_ * auVar121._4_4_;
          auVar106._8_4_ = auVar164._8_4_ * auVar121._8_4_;
          auVar106._12_4_ = auVar164._12_4_ * auVar121._12_4_;
          auVar121 = vmaxps_avx(auVar82,auVar106);
          pfVar3 = (float *)(uVar20 + 0x80 + uVar38);
          pfVar1 = (float *)(uVar20 + 0x20 + uVar38);
          auVar107._0_4_ = fVar52 * *pfVar3 + *pfVar1;
          auVar107._4_4_ = fVar52 * pfVar3[1] + pfVar1[1];
          auVar107._8_4_ = fVar52 * pfVar3[2] + pfVar1[2];
          auVar107._12_4_ = fVar52 * pfVar3[3] + pfVar1[3];
          local_1108 = vmaxps_avx(auVar84,auVar121);
          auVar84 = vsubps_avx(auVar107,auVar149._0_16_);
          pfVar3 = (float *)(uVar20 + 0x80 + uVar39);
          auVar83._0_4_ = auVar172._0_4_ * auVar84._0_4_;
          auVar83._4_4_ = auVar172._4_4_ * auVar84._4_4_;
          auVar83._8_4_ = auVar172._8_4_ * auVar84._8_4_;
          auVar83._12_4_ = auVar172._12_4_ * auVar84._12_4_;
          pfVar1 = (float *)(uVar20 + 0x20 + uVar39);
          auVar108._0_4_ = fVar52 * *pfVar3 + *pfVar1;
          auVar108._4_4_ = fVar52 * pfVar3[1] + pfVar1[1];
          auVar108._8_4_ = fVar52 * pfVar3[2] + pfVar1[2];
          auVar108._12_4_ = fVar52 * pfVar3[3] + pfVar1[3];
          auVar84 = vsubps_avx(auVar108,auVar156._0_16_);
          pfVar3 = (float *)(uVar20 + 0x80 + uVar25);
          pfVar1 = (float *)(uVar20 + 0x20 + uVar25);
          auVar124._0_4_ = fVar52 * *pfVar3 + *pfVar1;
          auVar124._4_4_ = fVar52 * pfVar3[1] + pfVar1[1];
          auVar124._8_4_ = fVar52 * pfVar3[2] + pfVar1[2];
          auVar124._12_4_ = fVar52 * pfVar3[3] + pfVar1[3];
          auVar109._0_4_ = auVar179._0_4_ * auVar84._0_4_;
          auVar109._4_4_ = auVar179._4_4_ * auVar84._4_4_;
          auVar109._8_4_ = auVar179._8_4_ * auVar84._8_4_;
          auVar109._12_4_ = auVar179._12_4_ * auVar84._12_4_;
          auVar84 = vsubps_avx(auVar124,auVar135._0_16_);
          auVar125._0_4_ = auVar185._0_4_ * auVar84._0_4_;
          auVar125._4_4_ = auVar185._4_4_ * auVar84._4_4_;
          auVar125._8_4_ = auVar185._8_4_ * auVar84._8_4_;
          auVar125._12_4_ = auVar185._12_4_ * auVar84._12_4_;
          auVar84 = vminps_avx(auVar109,auVar125);
          auVar121 = vminps_avx(auVar48._0_16_,auVar83);
          auVar84 = vminps_avx(auVar121,auVar84);
          auVar84 = vcmpps_avx(local_1108,auVar84,2);
          if (((uint)uVar40 & 7) == 6) {
            auVar121 = vcmpps_avx(*(undefined1 (*) [16])(uVar20 + 0xe0),auVar94,2);
            auVar94 = vcmpps_avx(auVar94,*(undefined1 (*) [16])(uVar20 + 0xf0),1);
            auVar121 = vandps_avx(auVar121,auVar94);
            auVar84 = vandps_avx(auVar121,auVar84);
          }
          auVar84 = vpslld_avx(auVar84,0x1f);
          uVar24 = vmovmskps_avx(auVar84);
          if (uVar24 == 0) {
            auVar84 = vmovshdup_avx(*(undefined1 (*) [16])
                                     ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc));
            auVar63 = ZEXT1664(auVar84);
            if (pauVar19 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_011dcb59;
          }
          uVar24 = uVar24 & 0xff;
          lVar8 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
            }
          }
          uVar40 = *(ulong *)(uVar20 + lVar8 * 8);
          uVar24 = uVar24 - 1 & uVar24;
          if (uVar24 != 0) {
            uVar6 = *(uint *)(local_1108 + lVar8 * 4);
            lVar8 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
              }
            }
            uVar28 = *(ulong *)(uVar20 + lVar8 * 8);
            uVar5 = *(uint *)(local_1108 + lVar8 * 4);
            uVar24 = uVar24 - 1 & uVar24;
            uVar27 = local_12a0;
            uVar35 = local_12a8;
            if (uVar24 == 0) {
              if (uVar6 < uVar5) {
                *(ulong *)*pauVar19 = uVar28;
                *(uint *)(*pauVar19 + 8) = uVar5;
                pauVar19 = pauVar19 + 1;
              }
              else {
                *(ulong *)*pauVar19 = uVar40;
                *(uint *)(*pauVar19 + 8) = uVar6;
                pauVar19 = pauVar19 + 1;
                uVar40 = uVar28;
              }
            }
            else {
              auVar53._8_8_ = 0;
              auVar53._0_8_ = uVar40;
              auVar84 = vpunpcklqdq_avx(auVar53,ZEXT416(uVar6));
              auVar70._8_8_ = 0;
              auVar70._0_8_ = uVar28;
              auVar121 = vpunpcklqdq_avx(auVar70,ZEXT416(uVar5));
              lVar8 = 0;
              if (uVar24 != 0) {
                for (; (uVar24 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
                }
              }
              auVar85._8_8_ = 0;
              auVar85._0_8_ = *(ulong *)(uVar20 + lVar8 * 8);
              auVar68 = vpunpcklqdq_avx(auVar85,ZEXT416(*(uint *)(local_1108 + lVar8 * 4)));
              auVar94 = vpcmpgtd_avx(auVar121,auVar84);
              uVar24 = uVar24 - 1 & uVar24;
              if (uVar24 == 0) {
                auVar80 = vpshufd_avx(auVar94,0xaa);
                auVar94 = vblendvps_avx(auVar121,auVar84,auVar80);
                auVar84 = vblendvps_avx(auVar84,auVar121,auVar80);
                auVar121 = vpcmpgtd_avx(auVar68,auVar94);
                auVar80 = vpshufd_avx(auVar121,0xaa);
                auVar121 = vblendvps_avx(auVar68,auVar94,auVar80);
                auVar94 = vblendvps_avx(auVar94,auVar68,auVar80);
                auVar68 = vpcmpgtd_avx(auVar94,auVar84);
                auVar80 = vpshufd_avx(auVar68,0xaa);
                auVar68 = vblendvps_avx(auVar94,auVar84,auVar80);
                auVar84 = vblendvps_avx(auVar84,auVar94,auVar80);
                *pauVar19 = auVar84;
                pauVar19[1] = auVar68;
                uVar40 = auVar121._0_8_;
                pauVar19 = pauVar19 + 2;
              }
              else {
                lVar8 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
                  }
                }
                auVar126._8_8_ = 0;
                auVar126._0_8_ = *(ulong *)(uVar20 + lVar8 * 8);
                auVar104 = vpunpcklqdq_avx(auVar126,ZEXT416(*(uint *)(local_1108 + lVar8 * 4)));
                auVar80 = vpshufd_avx(auVar94,0xaa);
                auVar94 = vblendvps_avx(auVar121,auVar84,auVar80);
                auVar84 = vblendvps_avx(auVar84,auVar121,auVar80);
                auVar121 = vpcmpgtd_avx(auVar104,auVar68);
                auVar80 = vpshufd_avx(auVar121,0xaa);
                auVar121 = vblendvps_avx(auVar104,auVar68,auVar80);
                auVar68 = vblendvps_avx(auVar68,auVar104,auVar80);
                auVar80 = vpcmpgtd_avx(auVar68,auVar84);
                auVar104 = vpshufd_avx(auVar80,0xaa);
                auVar80 = vblendvps_avx(auVar68,auVar84,auVar104);
                auVar84 = vblendvps_avx(auVar84,auVar68,auVar104);
                auVar68 = vpcmpgtd_avx(auVar121,auVar94);
                auVar104 = vpshufd_avx(auVar68,0xaa);
                auVar68 = vblendvps_avx(auVar121,auVar94,auVar104);
                auVar121 = vblendvps_avx(auVar94,auVar121,auVar104);
                auVar94 = vpcmpgtd_avx(auVar80,auVar121);
                auVar104 = vpshufd_avx(auVar94,0xaa);
                auVar94 = vblendvps_avx(auVar80,auVar121,auVar104);
                auVar121 = vblendvps_avx(auVar121,auVar80,auVar104);
                *pauVar19 = auVar84;
                pauVar19[1] = auVar121;
                pauVar19[2] = auVar94;
                auVar135 = ZEXT1664(local_1138);
                uVar40 = auVar68._0_8_;
                pauVar19 = pauVar19 + 3;
              }
            }
          }
        }
        local_1180 = (ulong)((uint)uVar40 & 0xf) - 8;
        if (local_1180 != 0) {
          uVar40 = uVar40 & 0xfffffffffffffff0;
          local_1178 = 0;
          do {
            lVar36 = local_1178 * 0x50;
            local_1170 = context->scene;
            pGVar7 = (context->scene->geometries).items[*(uint *)(uVar40 + 0x30 + lVar36)].ptr;
            fVar52 = (pGVar7->time_range).lower;
            fVar52 = pGVar7->fnumTimeSegments *
                     (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar52) /
                     ((pGVar7->time_range).upper - fVar52));
            auVar84 = vroundss_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52),9);
            auVar84 = vminss_avx(auVar84,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
            auVar105 = vmaxss_avx(ZEXT816(0),auVar84);
            lVar21 = (long)(int)auVar105._0_4_ * 0x38;
            uVar37 = (ulong)*(uint *)(uVar40 + 4 + lVar36);
            lVar8 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar21);
            lVar21 = *(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar21);
            auVar84 = *(undefined1 (*) [16])(lVar8 + (ulong)*(uint *)(uVar40 + lVar36) * 4);
            uVar20 = (ulong)*(uint *)(uVar40 + 0x10 + lVar36);
            auVar121 = *(undefined1 (*) [16])(lVar8 + uVar20 * 4);
            uVar28 = (ulong)*(uint *)(uVar40 + 0x20 + lVar36);
            auVar109 = *(undefined1 (*) [16])(lVar8 + uVar28 * 4);
            auVar94 = *(undefined1 (*) [16])(lVar8 + uVar37 * 4);
            uVar29 = (ulong)*(uint *)(uVar40 + 0x14 + lVar36);
            auVar68 = *(undefined1 (*) [16])(lVar8 + uVar29 * 4);
            uVar30 = (ulong)*(uint *)(uVar40 + 0x24 + lVar36);
            auVar124 = *(undefined1 (*) [16])(lVar8 + uVar30 * 4);
            uVar31 = (ulong)*(uint *)(uVar40 + 8 + lVar36);
            auVar80 = *(undefined1 (*) [16])(lVar8 + uVar31 * 4);
            uVar27 = (ulong)*(uint *)(uVar40 + 0x18 + lVar36);
            auVar104 = *(undefined1 (*) [16])(lVar8 + uVar27 * 4);
            uVar32 = (ulong)*(uint *)(uVar40 + 0x28 + lVar36);
            auVar122 = *(undefined1 (*) [16])(lVar8 + uVar32 * 4);
            uVar33 = (ulong)*(uint *)(uVar40 + 0xc + lVar36);
            auVar123 = *(undefined1 (*) [16])(lVar8 + uVar33 * 4);
            uVar35 = (ulong)*(uint *)(uVar40 + 0x1c + lVar36);
            auVar69 = *(undefined1 (*) [16])(lVar8 + uVar35 * 4);
            uVar22 = (ulong)*(uint *)(uVar40 + 0x2c + lVar36);
            auVar81 = *(undefined1 (*) [16])(lVar8 + uVar22 * 4);
            auVar82 = *(undefined1 (*) [16])(lVar21 + (ulong)*(uint *)(uVar40 + lVar36) * 4);
            auVar83 = *(undefined1 (*) [16])(lVar21 + uVar20 * 4);
            fVar52 = fVar52 - auVar105._0_4_;
            auVar105 = vunpcklps_avx(auVar84,auVar80);
            auVar80 = vunpckhps_avx(auVar84,auVar80);
            auVar106 = vunpcklps_avx(auVar94,auVar123);
            auVar94 = vunpckhps_avx(auVar94,auVar123);
            auVar84 = *(undefined1 (*) [16])(lVar21 + uVar37 * 4);
            auVar107 = vunpcklps_avx(auVar80,auVar94);
            auVar108 = vunpcklps_avx(auVar105,auVar106);
            auVar80 = vunpckhps_avx(auVar105,auVar106);
            auVar123 = vunpcklps_avx(auVar121,auVar104);
            auVar94 = vunpckhps_avx(auVar121,auVar104);
            auVar104 = vunpcklps_avx(auVar68,auVar69);
            auVar68 = vunpckhps_avx(auVar68,auVar69);
            auVar121 = *(undefined1 (*) [16])(lVar21 + uVar31 * 4);
            auVar69 = vunpcklps_avx(auVar94,auVar68);
            auVar105 = vunpcklps_avx(auVar123,auVar104);
            auVar68 = vunpckhps_avx(auVar123,auVar104);
            auVar123 = vunpcklps_avx(auVar109,auVar122);
            auVar104 = vunpckhps_avx(auVar109,auVar122);
            auVar106 = vunpcklps_avx(auVar124,auVar81);
            auVar122 = vunpckhps_avx(auVar124,auVar81);
            auVar94 = *(undefined1 (*) [16])(lVar21 + uVar33 * 4);
            auVar81 = vunpcklps_avx(auVar104,auVar122);
            auVar109 = vunpcklps_avx(auVar123,auVar106);
            auVar104 = vunpckhps_avx(auVar123,auVar106);
            auVar122 = vunpcklps_avx(auVar82,auVar121);
            auVar121 = vunpckhps_avx(auVar82,auVar121);
            auVar123 = vunpcklps_avx(auVar84,auVar94);
            auVar94 = vunpckhps_avx(auVar84,auVar94);
            auVar84 = *(undefined1 (*) [16])(lVar21 + uVar27 * 4);
            auVar82 = vunpcklps_avx(auVar121,auVar94);
            auVar106 = vunpcklps_avx(auVar122,auVar123);
            auVar94 = vunpckhps_avx(auVar122,auVar123);
            auVar123 = vunpcklps_avx(auVar83,auVar84);
            auVar122 = vunpckhps_avx(auVar83,auVar84);
            auVar84 = *(undefined1 (*) [16])(lVar21 + uVar29 * 4);
            auVar121 = *(undefined1 (*) [16])(lVar21 + uVar35 * 4);
            auVar83 = vunpcklps_avx(auVar84,auVar121);
            auVar84 = vunpckhps_avx(auVar84,auVar121);
            auVar124 = vunpcklps_avx(auVar122,auVar84);
            auVar125 = vunpcklps_avx(auVar123,auVar83);
            auVar122 = vunpckhps_avx(auVar123,auVar83);
            auVar84 = *(undefined1 (*) [16])(lVar21 + uVar28 * 4);
            auVar121 = *(undefined1 (*) [16])(lVar21 + uVar32 * 4);
            auVar83 = vunpcklps_avx(auVar84,auVar121);
            auVar123 = vunpckhps_avx(auVar84,auVar121);
            auVar84 = *(undefined1 (*) [16])(lVar21 + uVar30 * 4);
            auVar121 = *(undefined1 (*) [16])(lVar21 + uVar22 * 4);
            auVar53 = vunpcklps_avx(auVar84,auVar121);
            auVar84 = vunpckhps_avx(auVar84,auVar121);
            auVar70 = vunpcklps_avx(auVar123,auVar84);
            auVar85 = vunpcklps_avx(auVar83,auVar53);
            auVar123 = vunpckhps_avx(auVar83,auVar53);
            auVar84 = vshufps_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52),0);
            auVar121 = vshufps_avx(ZEXT416((uint)(1.0 - fVar52)),ZEXT416((uint)(1.0 - fVar52)),0);
            fVar79 = auVar84._0_4_;
            fVar97 = auVar84._4_4_;
            fVar99 = auVar84._8_4_;
            fVar101 = auVar84._12_4_;
            fVar52 = auVar121._0_4_;
            fVar64 = auVar121._4_4_;
            fVar166 = auVar121._8_4_;
            fVar168 = auVar121._12_4_;
            auVar131._0_4_ = fVar52 * auVar108._0_4_ + fVar79 * auVar106._0_4_;
            auVar131._4_4_ = fVar64 * auVar108._4_4_ + fVar97 * auVar106._4_4_;
            auVar131._8_4_ = fVar166 * auVar108._8_4_ + fVar99 * auVar106._8_4_;
            auVar131._12_4_ = fVar168 * auVar108._12_4_ + fVar101 * auVar106._12_4_;
            auVar136._0_4_ = fVar52 * auVar80._0_4_ + fVar79 * auVar94._0_4_;
            auVar136._4_4_ = fVar64 * auVar80._4_4_ + fVar97 * auVar94._4_4_;
            auVar136._8_4_ = fVar166 * auVar80._8_4_ + fVar99 * auVar94._8_4_;
            auVar136._12_4_ = fVar168 * auVar80._12_4_ + fVar101 * auVar94._12_4_;
            local_11c8._0_4_ = auVar107._0_4_;
            local_11c8._4_4_ = auVar107._4_4_;
            fStack_11c0 = auVar107._8_4_;
            fStack_11bc = auVar107._12_4_;
            auVar110._0_4_ = fVar52 * (float)local_11c8._0_4_ + fVar79 * auVar82._0_4_;
            auVar110._4_4_ = fVar64 * (float)local_11c8._4_4_ + fVar97 * auVar82._4_4_;
            auVar110._8_4_ = fVar166 * fStack_11c0 + fVar99 * auVar82._8_4_;
            auVar110._12_4_ = fVar168 * fStack_11bc + fVar101 * auVar82._12_4_;
            auVar144._0_4_ = fVar52 * auVar105._0_4_ + fVar79 * auVar125._0_4_;
            auVar144._4_4_ = fVar64 * auVar105._4_4_ + fVar97 * auVar125._4_4_;
            auVar144._8_4_ = fVar166 * auVar105._8_4_ + fVar99 * auVar125._8_4_;
            auVar144._12_4_ = fVar168 * auVar105._12_4_ + fVar101 * auVar125._12_4_;
            auVar127._0_4_ = fVar52 * auVar68._0_4_ + fVar79 * auVar122._0_4_;
            auVar127._4_4_ = fVar64 * auVar68._4_4_ + fVar97 * auVar122._4_4_;
            auVar127._8_4_ = fVar166 * auVar68._8_4_ + fVar99 * auVar122._8_4_;
            auVar127._12_4_ = fVar168 * auVar68._12_4_ + fVar101 * auVar122._12_4_;
            puVar2 = (undefined8 *)(uVar40 + 0x30 + lVar36);
            local_f88 = *puVar2;
            uStack_f80 = puVar2[1];
            puVar2 = (undefined8 *)(uVar40 + 0x40 + lVar36);
            local_1218._0_4_ = auVar69._0_4_;
            local_1218._4_4_ = auVar69._4_4_;
            fStack_1210 = auVar69._8_4_;
            fStack_120c = auVar69._12_4_;
            auVar54._0_4_ = fVar52 * (float)local_1218._0_4_ + fVar79 * auVar124._0_4_;
            auVar54._4_4_ = fVar64 * (float)local_1218._4_4_ + fVar97 * auVar124._4_4_;
            auVar54._8_4_ = fVar166 * fStack_1210 + fVar99 * auVar124._8_4_;
            auVar54._12_4_ = fVar168 * fStack_120c + fVar101 * auVar124._12_4_;
            local_1198._0_4_ = auVar109._0_4_;
            local_1198._4_4_ = auVar109._4_4_;
            fStack_1190 = auVar109._8_4_;
            fStack_118c = auVar109._12_4_;
            auVar71._0_4_ = fVar52 * (float)local_1198._0_4_ + fVar79 * auVar85._0_4_;
            auVar71._4_4_ = fVar64 * (float)local_1198._4_4_ + fVar97 * auVar85._4_4_;
            auVar71._8_4_ = fVar166 * fStack_1190 + fVar99 * auVar85._8_4_;
            auVar71._12_4_ = fVar168 * fStack_118c + fVar101 * auVar85._12_4_;
            local_1238._0_4_ = auVar104._0_4_;
            local_1238._4_4_ = auVar104._4_4_;
            fStack_1230 = auVar104._8_4_;
            fStack_122c = auVar104._12_4_;
            auVar184._0_4_ = fVar52 * (float)local_1238._0_4_ + fVar79 * auVar123._0_4_;
            auVar184._4_4_ = fVar64 * (float)local_1238._4_4_ + fVar97 * auVar123._4_4_;
            auVar184._8_4_ = fVar166 * fStack_1230 + fVar99 * auVar123._8_4_;
            auVar184._12_4_ = fVar168 * fStack_122c + fVar101 * auVar123._12_4_;
            local_1228._0_4_ = auVar81._0_4_;
            local_1228._4_4_ = auVar81._4_4_;
            fStack_1220 = auVar81._8_4_;
            fStack_121c = auVar81._12_4_;
            auVar153._0_4_ = fVar79 * auVar70._0_4_ + fVar52 * (float)local_1228._0_4_;
            auVar153._4_4_ = fVar97 * auVar70._4_4_ + fVar64 * (float)local_1228._4_4_;
            auVar153._8_4_ = fVar99 * auVar70._8_4_ + fVar166 * fStack_1220;
            auVar153._12_4_ = fVar101 * auVar70._12_4_ + fVar168 * fStack_121c;
            local_1118 = *puVar2;
            uStack_1110 = puVar2[1];
            uVar18 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar41._4_4_ = uVar18;
            auVar41._0_4_ = uVar18;
            auVar41._8_4_ = uVar18;
            auVar41._12_4_ = uVar18;
            uVar18 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar171._4_4_ = uVar18;
            auVar171._0_4_ = uVar18;
            auVar171._8_4_ = uVar18;
            auVar171._12_4_ = uVar18;
            uVar18 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar177._4_4_ = uVar18;
            auVar177._0_4_ = uVar18;
            auVar177._8_4_ = uVar18;
            auVar177._12_4_ = uVar18;
            _local_1218 = vsubps_avx(auVar131,auVar41);
            _local_1228 = vsubps_avx(auVar136,auVar171);
            _local_1238 = vsubps_avx(auVar110,auVar177);
            auVar84 = vsubps_avx(auVar144,auVar41);
            auVar121 = vsubps_avx(auVar127,auVar171);
            auVar94 = vsubps_avx(auVar54,auVar177);
            auVar68 = vsubps_avx(auVar71,auVar41);
            auVar80 = vsubps_avx(auVar184,auVar171);
            auVar104 = vsubps_avx(auVar153,auVar177);
            _local_1198 = vsubps_avx(auVar68,_local_1218);
            local_11a8 = vsubps_avx(auVar80,_local_1228);
            local_11b8 = vsubps_avx(auVar104,_local_1238);
            fVar166 = local_1228._0_4_;
            fVar52 = auVar80._0_4_ + fVar166;
            fVar97 = local_1228._4_4_;
            fVar64 = auVar80._4_4_ + fVar97;
            fVar9 = local_1228._8_4_;
            fVar65 = auVar80._8_4_ + fVar9;
            fVar12 = local_1228._12_4_;
            fVar66 = auVar80._12_4_ + fVar12;
            fVar168 = local_1238._0_4_;
            fVar102 = auVar104._0_4_ + fVar168;
            fVar99 = local_1238._4_4_;
            fVar113 = auVar104._4_4_ + fVar99;
            fVar10 = local_1238._8_4_;
            fVar115 = auVar104._8_4_ + fVar10;
            fVar13 = local_1238._12_4_;
            fVar118 = auVar104._12_4_ + fVar13;
            fVar67 = local_11b8._0_4_;
            auVar145._0_4_ = fVar67 * fVar52;
            fVar49 = local_11b8._4_4_;
            auVar145._4_4_ = fVar49 * fVar64;
            fVar50 = local_11b8._8_4_;
            auVar145._8_4_ = fVar50 * fVar65;
            fVar51 = local_11b8._12_4_;
            auVar145._12_4_ = fVar51 * fVar66;
            fVar183 = local_11a8._0_4_;
            auVar154._0_4_ = fVar183 * fVar102;
            fVar186 = local_11a8._4_4_;
            auVar154._4_4_ = fVar186 * fVar113;
            fVar187 = local_11a8._8_4_;
            auVar154._8_4_ = fVar187 * fVar115;
            fVar188 = local_11a8._12_4_;
            auVar154._12_4_ = fVar188 * fVar118;
            auVar122 = vsubps_avx(auVar154,auVar145);
            fVar79 = local_1218._0_4_;
            fVar143 = auVar68._0_4_ + fVar79;
            fVar101 = local_1218._4_4_;
            fVar150 = auVar68._4_4_ + fVar101;
            fVar11 = local_1218._8_4_;
            fVar151 = auVar68._8_4_ + fVar11;
            fVar14 = local_1218._12_4_;
            fVar152 = auVar68._12_4_ + fVar14;
            fVar176 = local_1198._0_4_;
            auVar111._0_4_ = fVar176 * fVar102;
            fVar180 = local_1198._4_4_;
            auVar111._4_4_ = fVar180 * fVar113;
            fVar181 = local_1198._8_4_;
            auVar111._8_4_ = fVar181 * fVar115;
            fVar182 = local_1198._12_4_;
            auVar111._12_4_ = fVar182 * fVar118;
            auVar155._0_4_ = fVar143 * fVar67;
            auVar155._4_4_ = fVar150 * fVar49;
            auVar155._8_4_ = fVar151 * fVar50;
            auVar155._12_4_ = fVar152 * fVar51;
            auVar123 = vsubps_avx(auVar155,auVar111);
            auVar146._0_4_ = fVar183 * fVar143;
            auVar146._4_4_ = fVar186 * fVar150;
            auVar146._8_4_ = fVar187 * fVar151;
            auVar146._12_4_ = fVar188 * fVar152;
            auVar42._0_4_ = fVar176 * fVar52;
            auVar42._4_4_ = fVar180 * fVar64;
            auVar42._8_4_ = fVar181 * fVar65;
            auVar42._12_4_ = fVar182 * fVar66;
            auVar69 = vsubps_avx(auVar42,auVar146);
            local_1298._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar52 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar64 = (ray->super_RayK<1>).dir.field_0.m128[0];
            local_1258._0_4_ =
                 auVar122._0_4_ * fVar64 +
                 fVar52 * auVar123._0_4_ + local_1298._4_4_ * auVar69._0_4_;
            local_1258._4_4_ =
                 auVar122._4_4_ * fVar64 +
                 fVar52 * auVar123._4_4_ + local_1298._4_4_ * auVar69._4_4_;
            local_1258._8_4_ =
                 auVar122._8_4_ * fVar64 +
                 fVar52 * auVar123._8_4_ + local_1298._4_4_ * auVar69._8_4_;
            local_1258._12_4_ =
                 auVar122._12_4_ * fVar64 +
                 fVar52 * auVar123._12_4_ + local_1298._4_4_ * auVar69._12_4_;
            _local_11c8 = vsubps_avx(_local_1228,auVar121);
            local_fa8 = vsubps_avx(_local_1238,auVar94);
            fVar66 = fVar166 + auVar121._0_4_;
            fVar113 = fVar97 + auVar121._4_4_;
            fVar118 = fVar9 + auVar121._8_4_;
            fVar150 = fVar12 + auVar121._12_4_;
            fVar151 = fVar168 + auVar94._0_4_;
            fVar152 = fVar99 + auVar94._4_4_;
            fVar116 = fVar10 + auVar94._8_4_;
            fVar119 = fVar13 + auVar94._12_4_;
            fVar65 = local_fa8._0_4_;
            auVar178._0_4_ = fVar65 * fVar66;
            fVar102 = local_fa8._4_4_;
            auVar178._4_4_ = fVar102 * fVar113;
            fVar115 = local_fa8._8_4_;
            auVar178._8_4_ = fVar115 * fVar118;
            fVar143 = local_fa8._12_4_;
            auVar178._12_4_ = fVar143 * fVar150;
            fVar170 = local_11c8._0_4_;
            auVar86._0_4_ = fVar170 * fVar151;
            fVar173 = local_11c8._4_4_;
            auVar86._4_4_ = fVar173 * fVar152;
            fVar174 = local_11c8._8_4_;
            auVar86._8_4_ = fVar174 * fVar116;
            fVar175 = local_11c8._12_4_;
            auVar86._12_4_ = fVar175 * fVar119;
            auVar122 = vsubps_avx(auVar86,auVar178);
            local_f98 = vsubps_avx(_local_1218,auVar84);
            fVar158 = local_f98._0_4_;
            auVar112._0_4_ = fVar158 * fVar151;
            fVar160 = local_f98._4_4_;
            auVar112._4_4_ = fVar160 * fVar152;
            fVar161 = local_f98._8_4_;
            auVar112._8_4_ = fVar161 * fVar116;
            fVar162 = local_f98._12_4_;
            auVar112._12_4_ = fVar162 * fVar119;
            fVar151 = fVar79 + auVar84._0_4_;
            fVar152 = fVar101 + auVar84._4_4_;
            fVar116 = fVar11 + auVar84._8_4_;
            fVar119 = fVar14 + auVar84._12_4_;
            auVar147._0_4_ = fVar65 * fVar151;
            auVar147._4_4_ = fVar102 * fVar152;
            auVar147._8_4_ = fVar115 * fVar116;
            auVar147._12_4_ = fVar143 * fVar119;
            auVar123 = vsubps_avx(auVar147,auVar112);
            auVar137._0_4_ = fVar170 * fVar151;
            auVar137._4_4_ = fVar173 * fVar152;
            auVar137._8_4_ = fVar174 * fVar116;
            auVar137._12_4_ = fVar175 * fVar119;
            auVar43._0_4_ = fVar158 * fVar66;
            auVar43._4_4_ = fVar160 * fVar113;
            auVar43._8_4_ = fVar161 * fVar118;
            auVar43._12_4_ = fVar162 * fVar150;
            auVar69 = vsubps_avx(auVar43,auVar137);
            local_10f8._0_4_ =
                 fVar64 * auVar122._0_4_ +
                 fVar52 * auVar123._0_4_ + local_1298._4_4_ * auVar69._0_4_;
            local_10f8._4_4_ =
                 fVar64 * auVar122._4_4_ +
                 fVar52 * auVar123._4_4_ + local_1298._4_4_ * auVar69._4_4_;
            local_10f8._8_4_ =
                 fVar64 * auVar122._8_4_ +
                 fVar52 * auVar123._8_4_ + local_1298._4_4_ * auVar69._8_4_;
            local_10f8._12_4_ =
                 fVar64 * auVar122._12_4_ +
                 fVar52 * auVar123._12_4_ + local_1298._4_4_ * auVar69._12_4_;
            auVar122 = vsubps_avx(auVar84,auVar68);
            fVar78 = auVar84._0_4_ + auVar68._0_4_;
            fVar96 = auVar84._4_4_ + auVar68._4_4_;
            fVar98 = auVar84._8_4_ + auVar68._8_4_;
            fVar100 = auVar84._12_4_ + auVar68._12_4_;
            auVar84 = vsubps_avx(auVar121,auVar80);
            fVar152 = auVar121._0_4_ + auVar80._0_4_;
            fVar116 = auVar121._4_4_ + auVar80._4_4_;
            fVar119 = auVar121._8_4_ + auVar80._8_4_;
            fVar77 = auVar121._12_4_ + auVar80._12_4_;
            auVar121 = vsubps_avx(auVar94,auVar104);
            fVar113 = auVar94._0_4_ + auVar104._0_4_;
            fVar118 = auVar94._4_4_ + auVar104._4_4_;
            fVar150 = auVar94._8_4_ + auVar104._8_4_;
            fVar151 = auVar94._12_4_ + auVar104._12_4_;
            fVar103 = auVar121._0_4_;
            auVar128._0_4_ = fVar103 * fVar152;
            fVar114 = auVar121._4_4_;
            auVar128._4_4_ = fVar114 * fVar116;
            fVar117 = auVar121._8_4_;
            auVar128._8_4_ = fVar117 * fVar119;
            fVar120 = auVar121._12_4_;
            auVar128._12_4_ = fVar120 * fVar77;
            fVar163 = auVar84._0_4_;
            auVar138._0_4_ = fVar163 * fVar113;
            fVar165 = auVar84._4_4_;
            auVar138._4_4_ = fVar165 * fVar118;
            fVar167 = auVar84._8_4_;
            auVar138._8_4_ = fVar167 * fVar150;
            fVar169 = auVar84._12_4_;
            auVar138._12_4_ = fVar169 * fVar151;
            auVar84 = vsubps_avx(auVar138,auVar128);
            fVar66 = auVar122._0_4_;
            auVar55._0_4_ = fVar66 * fVar113;
            fVar113 = auVar122._4_4_;
            auVar55._4_4_ = fVar113 * fVar118;
            fVar118 = auVar122._8_4_;
            auVar55._8_4_ = fVar118 * fVar150;
            fVar150 = auVar122._12_4_;
            auVar55._12_4_ = fVar150 * fVar151;
            auVar139._0_4_ = fVar103 * fVar78;
            auVar139._4_4_ = fVar114 * fVar96;
            auVar139._8_4_ = fVar117 * fVar98;
            auVar139._12_4_ = fVar120 * fVar100;
            auVar121 = vsubps_avx(auVar139,auVar55);
            auVar87._0_4_ = fVar163 * fVar78;
            auVar87._4_4_ = fVar165 * fVar96;
            auVar87._8_4_ = fVar167 * fVar98;
            auVar87._12_4_ = fVar169 * fVar100;
            auVar72._0_4_ = fVar66 * fVar152;
            auVar72._4_4_ = fVar113 * fVar116;
            auVar72._8_4_ = fVar118 * fVar119;
            auVar72._12_4_ = fVar150 * fVar77;
            auVar94 = vsubps_avx(auVar72,auVar87);
            local_1298._0_4_ = (uint)local_1298._4_4_;
            fStack_1290 = local_1298._4_4_;
            fStack_128c = local_1298._4_4_;
            auVar56._0_4_ =
                 fVar64 * auVar84._0_4_ + fVar52 * auVar121._0_4_ + local_1298._4_4_ * auVar94._0_4_
            ;
            auVar56._4_4_ =
                 fVar64 * auVar84._4_4_ + fVar52 * auVar121._4_4_ + local_1298._4_4_ * auVar94._4_4_
            ;
            auVar56._8_4_ =
                 fVar64 * auVar84._8_4_ + fVar52 * auVar121._8_4_ + local_1298._4_4_ * auVar94._8_4_
            ;
            auVar56._12_4_ =
                 fVar64 * auVar84._12_4_ +
                 fVar52 * auVar121._12_4_ + local_1298._4_4_ * auVar94._12_4_;
            local_10e8._0_4_ = auVar56._0_4_ + local_1258._0_4_ + local_10f8._0_4_;
            local_10e8._4_4_ = auVar56._4_4_ + local_1258._4_4_ + local_10f8._4_4_;
            local_10e8._8_4_ = auVar56._8_4_ + local_1258._8_4_ + local_10f8._8_4_;
            local_10e8._12_4_ = auVar56._12_4_ + local_1258._12_4_ + local_10f8._12_4_;
            auVar84 = vminps_avx(local_1258,local_10f8);
            auVar84 = vminps_avx(auVar84,auVar56);
            auVar88._8_4_ = 0x7fffffff;
            auVar88._0_8_ = 0x7fffffff7fffffff;
            auVar88._12_4_ = 0x7fffffff;
            local_fb8 = vandps_avx(local_10e8,auVar88);
            auVar89._0_4_ = local_fb8._0_4_ * 1.1920929e-07;
            auVar89._4_4_ = local_fb8._4_4_ * 1.1920929e-07;
            auVar89._8_4_ = local_fb8._8_4_ * 1.1920929e-07;
            auVar89._12_4_ = local_fb8._12_4_ * 1.1920929e-07;
            uVar27 = CONCAT44(auVar89._4_4_,auVar89._0_4_);
            auVar129._0_8_ = uVar27 ^ 0x8000000080000000;
            auVar129._8_4_ = -auVar89._8_4_;
            auVar129._12_4_ = -auVar89._12_4_;
            auVar84 = vcmpps_avx(auVar84,auVar129,5);
            auVar121 = vmaxps_avx(local_1258,local_10f8);
            auVar121 = vmaxps_avx(auVar121,auVar56);
            auVar121 = vcmpps_avx(auVar121,auVar89,2);
            local_fc8 = vorps_avx(auVar84,auVar121);
            local_12a9 = 0;
            auVar15._8_8_ = uStack_1120;
            auVar15._0_8_ = local_1128;
            auVar15 = auVar15 & local_fc8;
            if ((((auVar15 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar15 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar15 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar15[0xf] < '\0') {
              auVar57._0_4_ = fVar67 * fVar170;
              auVar57._4_4_ = fVar49 * fVar173;
              auVar57._8_4_ = fVar50 * fVar174;
              auVar57._12_4_ = fVar51 * fVar175;
              auVar73._0_4_ = fVar183 * fVar65;
              auVar73._4_4_ = fVar186 * fVar102;
              auVar73._8_4_ = fVar187 * fVar115;
              auVar73._12_4_ = fVar188 * fVar143;
              auVar94 = vsubps_avx(auVar73,auVar57);
              auVar90._0_4_ = fVar163 * fVar65;
              auVar90._4_4_ = fVar165 * fVar102;
              auVar90._8_4_ = fVar167 * fVar115;
              auVar90._12_4_ = fVar169 * fVar143;
              auVar130._0_4_ = fVar170 * fVar103;
              auVar130._4_4_ = fVar173 * fVar114;
              auVar130._8_4_ = fVar174 * fVar117;
              auVar130._12_4_ = fVar175 * fVar120;
              auVar68 = vsubps_avx(auVar130,auVar90);
              auVar140._8_4_ = 0x7fffffff;
              auVar140._0_8_ = 0x7fffffff7fffffff;
              auVar140._12_4_ = 0x7fffffff;
              auVar84 = vandps_avx(auVar57,auVar140);
              auVar121 = vandps_avx(auVar90,auVar140);
              auVar84 = vcmpps_avx(auVar84,auVar121,1);
              local_1088 = vblendvps_avx(auVar68,auVar94,auVar84);
              auVar58._0_4_ = fVar158 * fVar103;
              auVar58._4_4_ = fVar160 * fVar114;
              auVar58._8_4_ = fVar161 * fVar117;
              auVar58._12_4_ = fVar162 * fVar120;
              auVar74._0_4_ = fVar67 * fVar158;
              auVar74._4_4_ = fVar49 * fVar160;
              auVar74._8_4_ = fVar50 * fVar161;
              auVar74._12_4_ = fVar51 * fVar162;
              auVar91._0_4_ = fVar176 * fVar65;
              auVar91._4_4_ = fVar180 * fVar102;
              auVar91._8_4_ = fVar181 * fVar115;
              auVar91._12_4_ = fVar182 * fVar143;
              auVar94 = vsubps_avx(auVar74,auVar91);
              auVar132._0_4_ = fVar65 * fVar66;
              auVar132._4_4_ = fVar102 * fVar113;
              auVar132._8_4_ = fVar115 * fVar118;
              auVar132._12_4_ = fVar143 * fVar150;
              auVar68 = vsubps_avx(auVar132,auVar58);
              auVar84 = vandps_avx(auVar91,auVar140);
              auVar121 = vandps_avx(auVar58,auVar140);
              auVar84 = vcmpps_avx(auVar84,auVar121,1);
              local_1078 = vblendvps_avx(auVar68,auVar94,auVar84);
              auVar44._0_4_ = fVar170 * fVar66;
              auVar44._4_4_ = fVar173 * fVar113;
              auVar44._8_4_ = fVar174 * fVar118;
              auVar44._12_4_ = fVar175 * fVar150;
              auVar75._0_4_ = fVar176 * fVar170;
              auVar75._4_4_ = fVar180 * fVar173;
              auVar75._8_4_ = fVar181 * fVar174;
              auVar75._12_4_ = fVar182 * fVar175;
              auVar92._0_4_ = fVar183 * fVar158;
              auVar92._4_4_ = fVar186 * fVar160;
              auVar92._8_4_ = fVar187 * fVar161;
              auVar92._12_4_ = fVar188 * fVar162;
              auVar133._0_4_ = fVar158 * fVar163;
              auVar133._4_4_ = fVar160 * fVar165;
              auVar133._8_4_ = fVar161 * fVar167;
              auVar133._12_4_ = fVar162 * fVar169;
              auVar94 = vsubps_avx(auVar75,auVar92);
              auVar68 = vsubps_avx(auVar133,auVar44);
              auVar84 = vandps_avx(auVar92,auVar140);
              auVar121 = vandps_avx(auVar44,auVar140);
              auVar84 = vcmpps_avx(auVar84,auVar121,1);
              local_1068 = vblendvps_avx(auVar68,auVar94,auVar84);
              fVar67 = local_1088._0_4_ * fVar64 +
                       local_1078._0_4_ * fVar52 + local_1068._0_4_ * local_1298._4_4_;
              fVar65 = local_1088._4_4_ * fVar64 +
                       local_1078._4_4_ * fVar52 + local_1068._4_4_ * local_1298._4_4_;
              fVar66 = local_1088._8_4_ * fVar64 +
                       local_1078._8_4_ * fVar52 + local_1068._8_4_ * local_1298._4_4_;
              fVar52 = local_1088._12_4_ * fVar64 +
                       local_1078._12_4_ * fVar52 + local_1068._12_4_ * local_1298._4_4_;
              auVar76._0_4_ = fVar67 + fVar67;
              auVar76._4_4_ = fVar65 + fVar65;
              auVar76._8_4_ = fVar66 + fVar66;
              auVar76._12_4_ = fVar52 + fVar52;
              fVar79 = local_1088._0_4_ * fVar79 +
                       local_1078._0_4_ * fVar166 + local_1068._0_4_ * fVar168;
              fVar97 = local_1088._4_4_ * fVar101 +
                       local_1078._4_4_ * fVar97 + local_1068._4_4_ * fVar99;
              fVar99 = local_1088._8_4_ * fVar11 +
                       local_1078._8_4_ * fVar9 + local_1068._8_4_ * fVar10;
              fVar101 = local_1088._12_4_ * fVar14 +
                        local_1078._12_4_ * fVar12 + local_1068._12_4_ * fVar13;
              auVar84 = vrcpps_avx(auVar76);
              fVar52 = auVar84._0_4_;
              auVar141._0_4_ = auVar76._0_4_ * fVar52;
              fVar64 = auVar84._4_4_;
              auVar141._4_4_ = auVar76._4_4_ * fVar64;
              fVar166 = auVar84._8_4_;
              auVar141._8_4_ = auVar76._8_4_ * fVar166;
              fVar168 = auVar84._12_4_;
              auVar141._12_4_ = auVar76._12_4_ * fVar168;
              auVar148._8_4_ = 0x3f800000;
              auVar148._0_8_ = 0x3f8000003f800000;
              auVar148._12_4_ = 0x3f800000;
              auVar84 = vsubps_avx(auVar148,auVar141);
              local_1278._0_4_ = (fVar79 + fVar79) * (fVar52 + fVar52 * auVar84._0_4_);
              local_1278._4_4_ = (fVar97 + fVar97) * (fVar64 + fVar64 * auVar84._4_4_);
              local_1278._8_4_ = (fVar99 + fVar99) * (fVar166 + fVar166 * auVar84._8_4_);
              local_1278._12_4_ = (fVar101 + fVar101) * (fVar168 + fVar168 * auVar84._12_4_);
              uVar18 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar93._4_4_ = uVar18;
              auVar93._0_4_ = uVar18;
              auVar93._8_4_ = uVar18;
              auVar93._12_4_ = uVar18;
              auVar84 = vcmpps_avx(auVar93,local_1278,2);
              fVar52 = (ray->super_RayK<1>).tfar;
              auVar134._4_4_ = fVar52;
              auVar134._0_4_ = fVar52;
              auVar134._8_4_ = fVar52;
              auVar134._12_4_ = fVar52;
              auVar121 = vcmpps_avx(local_1278,auVar134,2);
              auVar84 = vandps_avx(auVar84,auVar121);
              auVar121 = vcmpps_avx(auVar76,_DAT_01f7aa10,4);
              auVar84 = vandps_avx(auVar121,auVar84);
              auVar16._8_8_ = uStack_1120;
              auVar16._0_8_ = local_1128;
              auVar121 = vandps_avx(local_fc8,auVar16);
              auVar84 = vpslld_avx(auVar84,0x1f);
              auVar94 = vpsrad_avx(auVar84,0x1f);
              auVar84 = auVar121 & auVar94;
              if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar84 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar84 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar84[0xf] < '\0') {
                local_1288._0_4_ = (ray->super_RayK<1>).tfar;
                local_1288._4_4_ = (ray->super_RayK<1>).mask;
                local_1288._8_4_ = (ray->super_RayK<1>).id;
                local_1288._12_4_ = (ray->super_RayK<1>).flags;
                auVar121 = vandps_avx(auVar94,auVar121);
                local_1108 = local_1258;
                local_10d8 = &local_12a9;
                local_10c8 = auVar121;
                local_1098 = local_1278;
                local_1208 = auVar121;
                auVar84 = vrcpps_avx(local_10e8);
                fVar52 = auVar84._0_4_;
                auVar59._0_4_ = local_10e8._0_4_ * fVar52;
                fVar64 = auVar84._4_4_;
                auVar59._4_4_ = local_10e8._4_4_ * fVar64;
                fVar166 = auVar84._8_4_;
                auVar59._8_4_ = local_10e8._8_4_ * fVar166;
                fVar168 = auVar84._12_4_;
                auVar59._12_4_ = local_10e8._12_4_ * fVar168;
                auVar95._8_4_ = 0x3f800000;
                auVar95._0_8_ = 0x3f8000003f800000;
                auVar95._12_4_ = 0x3f800000;
                auVar84 = vsubps_avx(auVar95,auVar59);
                auVar45._0_4_ = fVar52 + fVar52 * auVar84._0_4_;
                auVar45._4_4_ = fVar64 + fVar64 * auVar84._4_4_;
                auVar45._8_4_ = fVar166 + fVar166 * auVar84._8_4_;
                auVar45._12_4_ = fVar168 + fVar168 * auVar84._12_4_;
                auVar60._8_4_ = 0x219392ef;
                auVar60._0_8_ = 0x219392ef219392ef;
                auVar60._12_4_ = 0x219392ef;
                auVar84 = vcmpps_avx(local_fb8,auVar60,5);
                auVar84 = vandps_avx(auVar84,auVar45);
                auVar61._0_4_ = local_1258._0_4_ * auVar84._0_4_;
                auVar61._4_4_ = local_1258._4_4_ * auVar84._4_4_;
                auVar61._8_4_ = local_1258._8_4_ * auVar84._8_4_;
                auVar61._12_4_ = local_1258._12_4_ * auVar84._12_4_;
                local_10b8 = vminps_avx(auVar61,auVar95);
                auVar46._0_4_ = local_10f8._0_4_ * auVar84._0_4_;
                auVar46._4_4_ = local_10f8._4_4_ * auVar84._4_4_;
                auVar46._8_4_ = local_10f8._8_4_ * auVar84._8_4_;
                auVar46._12_4_ = local_10f8._12_4_ * auVar84._12_4_;
                local_10a8 = vminps_avx(auVar46,auVar95);
                auVar47._8_4_ = 0x7f800000;
                auVar47._0_8_ = 0x7f8000007f800000;
                auVar47._12_4_ = 0x7f800000;
                auVar84 = vblendvps_avx(auVar47,local_1278,auVar121);
                auVar94 = vshufps_avx(auVar84,auVar84,0xb1);
                auVar94 = vminps_avx(auVar94,auVar84);
                auVar68 = vshufpd_avx(auVar94,auVar94,1);
                auVar94 = vminps_avx(auVar68,auVar94);
                auVar84 = vcmpps_avx(auVar84,auVar94,0);
                auVar94 = auVar121 & auVar84;
                if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar94 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar94 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar94[0xf] < '\0') {
                  auVar121 = vandps_avx(auVar84,auVar121);
                }
                uVar24 = vextractps_avx(local_1288,1);
                uVar18 = vmovmskps_avx(auVar121);
                uVar27 = CONCAT44((int)((ulong)&local_12a9 >> 0x20),uVar18);
                piVar26 = (int *)0x0;
                if (uVar27 != 0) {
                  for (; (uVar27 >> (long)piVar26 & 1) == 0; piVar26 = (int *)((long)piVar26 + 1)) {
                  }
                }
                do {
                  uVar6 = *(uint *)((long)&local_f88 + (long)piVar26 * 4);
                  pGVar7 = (local_1170->geometries).items[uVar6].ptr;
                  if ((pGVar7->mask & uVar24) == 0) {
                    *(undefined4 *)(local_1208 + (long)piVar26 * 4) = 0;
                  }
                  else {
                    pRVar34 = local_1260->args;
                    if (pRVar34->filter == (RTCFilterFunctionN)0x0) {
                      pRVar23 = local_1260->user;
                      if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar52 = *(float *)(local_10b8 + (long)piVar26 * 4);
                        fVar64 = *(float *)(local_10a8 + (long)piVar26 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1098 + (long)piVar26 * 4);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_1088 + (long)piVar26 * 4);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_1078 + (long)piVar26 * 4);
                        (ray->Ng).field_0.field_0.z = *(float *)(local_1068 + (long)piVar26 * 4);
                        ray->u = fVar52;
                        ray->v = fVar64;
                        ray->primID = *(uint *)((long)&local_1118 + (long)piVar26 * 4);
                        ray->geomID = uVar6;
                        ray->instID[0] = pRVar23->instID[0];
                        ray->instPrimID[0] = pRVar23->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar23 = local_1260->user;
                    }
                    local_1168 = *(undefined4 *)(local_1088 + (long)piVar26 * 4);
                    local_1164 = *(undefined4 *)(local_1078 + (long)piVar26 * 4);
                    local_1160 = *(undefined4 *)(local_1068 + (long)piVar26 * 4);
                    local_115c = *(undefined4 *)(local_10b8 + (long)piVar26 * 4);
                    local_1158 = *(undefined4 *)(local_10a8 + (long)piVar26 * 4);
                    local_1154 = *(undefined4 *)((long)&local_1118 + (long)piVar26 * 4);
                    local_1150 = uVar6;
                    local_114c = pRVar23->instID[0];
                    local_1148 = pRVar23->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_1098 + (long)piVar26 * 4);
                    local_123c = -1;
                    local_11f8.valid = &local_123c;
                    local_11f8.geometryUserPtr = pGVar7->userPtr;
                    local_11f8.context = pRVar23;
                    local_11f8.ray = (RTCRayN *)ray;
                    local_11f8.hit = (RTCHitN *)&local_1168;
                    local_11f8.N = 1;
                    local_1218 = (undefined1  [8])pGVar7;
                    local_1298 = piVar26;
                    if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_011dd8e8:
                      if ((pRVar34->filter != (RTCFilterFunctionN)0x0) &&
                         (((pRVar34->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)((long)local_1218 + 0x3e) & 0x40) != 0)))) {
                        (*pRVar34->filter)(&local_11f8);
                        piVar26 = local_1298;
                        if (*local_11f8.valid == 0) goto LAB_011dd987;
                      }
                      (((Vec3f *)((long)local_11f8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_11f8.hit;
                      (((Vec3f *)((long)local_11f8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_11f8.hit + 4);
                      (((Vec3f *)((long)local_11f8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_11f8.hit + 8);
                      *(float *)((long)local_11f8.ray + 0x3c) = *(float *)(local_11f8.hit + 0xc);
                      *(float *)((long)local_11f8.ray + 0x40) = *(float *)(local_11f8.hit + 0x10);
                      *(float *)((long)local_11f8.ray + 0x44) = *(float *)(local_11f8.hit + 0x14);
                      *(float *)((long)local_11f8.ray + 0x48) = *(float *)(local_11f8.hit + 0x18);
                      *(float *)((long)local_11f8.ray + 0x4c) = *(float *)(local_11f8.hit + 0x1c);
                      *(float *)((long)local_11f8.ray + 0x50) = *(float *)(local_11f8.hit + 0x20);
                    }
                    else {
                      local_1258._0_8_ = pRVar34;
                      (*pGVar7->intersectionFilterN)(&local_11f8);
                      piVar26 = local_1298;
                      pRVar34 = (RTCIntersectArguments *)local_1258._0_8_;
                      if (*local_11f8.valid != 0) goto LAB_011dd8e8;
LAB_011dd987:
                      (ray->super_RayK<1>).tfar = (float)local_1288._0_4_;
                    }
                    *(undefined4 *)(local_1208 + (long)piVar26 * 4) = 0;
                    fVar52 = (ray->super_RayK<1>).tfar;
                    auVar62._4_4_ = fVar52;
                    auVar62._0_4_ = fVar52;
                    auVar62._8_4_ = fVar52;
                    auVar62._12_4_ = fVar52;
                    auVar84 = vcmpps_avx(local_1278,auVar62,2);
                    local_1208 = vandps_avx(auVar84,local_1208);
                    local_1288._0_4_ = (ray->super_RayK<1>).tfar;
                    local_1288._4_4_ = (ray->super_RayK<1>).mask;
                    local_1288._8_4_ = (ray->super_RayK<1>).id;
                    local_1288._12_4_ = (ray->super_RayK<1>).flags;
                    uVar24 = vextractps_avx(local_1288,1);
                  }
                  if ((((local_1208 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_1208 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_1208 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_1208[0xf]) break;
                  local_1298._0_4_ = uVar24;
                  BVHNIntersector1<4,16777232,true,embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Pluecker<4,true>>>
                  ::intersect(&local_11f8);
                  piVar26 = local_11f8.valid;
                  uVar24 = (uint)local_1298;
                } while( true );
              }
            }
            local_1178 = local_1178 + 1;
            context = local_1260;
          } while (local_1178 != local_1180);
        }
        fVar52 = (ray->super_RayK<1>).tfar;
        auVar48 = ZEXT1664(CONCAT412(fVar52,CONCAT48(fVar52,CONCAT44(fVar52,fVar52))));
        auVar63 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar149 = ZEXT1664(local_fd8);
        auVar156 = ZEXT1664(local_fe8);
        auVar157 = ZEXT1664(local_ff8);
        auVar159 = ZEXT1664(local_1008);
        auVar164 = ZEXT1664(local_1018);
        auVar172 = ZEXT1664(local_1028);
        auVar179 = ZEXT1664(local_1038);
        auVar185 = ZEXT1664(local_1048);
        auVar142 = ZEXT1664(local_1058);
        auVar135 = ZEXT1664(local_1138);
        uVar27 = local_12a0;
        uVar35 = local_12a8;
        uVar22 = local_1188;
      }
    } while (pauVar19 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }